

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionTest_GetStringReferenceCopy_Test::
TestBody(GeneratedMessageReflectionTest_GetStringReferenceCopy_Test *this)

{
  Reflection *this_00;
  Descriptor *this_01;
  FieldDescriptor *field;
  char *message;
  string_view value;
  string_view name;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  AssertHelper local_78;
  AssertionResult gtest_ar;
  string cord_scratch;
  TestCord cord_message;
  
  proto2_unittest::TestCord::TestCord(&cord_message);
  value._M_str = "bytes_cord";
  value._M_len = 10;
  proto2_unittest::TestCord::set_optional_bytes_cord(&cord_message,value);
  this_00 = proto2_unittest::TestCord::GetReflection();
  this_01 = proto2_unittest::TestCord::GetDescriptor();
  cord_scratch._M_dataplus._M_p = (pointer)&cord_scratch.field_2;
  cord_scratch._M_string_length = 0;
  cord_scratch.field_2._M_local_buf[0] = '\0';
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&cord_scratch;
  name._M_str = "optional_bytes_cord";
  name._M_len = 0x13;
  field = Descriptor::FindFieldByName(this_01,name);
  local_78.data_ =
       (AssertHelperData *)
       Reflection::GetStringReference(this_00,&cord_message.super_Message,field,&cord_scratch);
  testing::internal::CmpHelperEQ<std::__cxx11::string*,std::__cxx11::string_const*>
            ((internal *)&gtest_ar,"&cord_scratch",
             "&cord_reflection->GetStringReference( cord_message, descriptor->FindFieldByName(\"optional_bytes_cord\"), &cord_scratch)"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_80);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection_unittest.cc"
               ,0xaa,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((string *)local_80._M_head_impl != (string *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&cord_scratch);
  proto2_unittest::TestCord::~TestCord(&cord_message);
  return;
}

Assistant:

TEST(GeneratedMessageReflectionTest, GetStringReferenceCopy) {
  // Test that GetStringReference() returns the scratch string when the
  // underlying representation is not a normal string.
  unittest::TestCord cord_message;
  cord_message.set_optional_bytes_cord("bytes_cord");

  const Reflection* cord_reflection = cord_message.GetReflection();
  const Descriptor* descriptor = unittest::TestCord::descriptor();
  std::string cord_scratch;
  EXPECT_EQ(
      &cord_scratch,
      &cord_reflection->GetStringReference(
          cord_message, descriptor->FindFieldByName("optional_bytes_cord"),
          &cord_scratch));
}